

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

uchar * CVariableInt::Unpack(uchar *pSrc,int *pInOut)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  
  bVar2 = *pSrc;
  uVar3 = bVar2 & 0x3f;
  *pInOut = uVar3;
  if ((char)*pSrc < '\0') {
    uVar3 = (pSrc[1] & 0x7f) << 6 | uVar3;
    *pInOut = uVar3;
    if ((char)pSrc[1] < '\0') {
      uVar3 = (pSrc[2] & 0x7f) << 0xd | uVar3;
      *pInOut = uVar3;
      if ((char)pSrc[2] < '\0') {
        uVar3 = (pSrc[3] & 0x7f) << 0x14 | uVar3;
        *pInOut = uVar3;
        if ((char)pSrc[3] < '\0') {
          pbVar1 = pSrc + 4;
          pSrc = pSrc + 4;
          *pInOut = (*pbVar1 & 0xf) << 0x1b | uVar3;
        }
        else {
          pSrc = pSrc + 3;
        }
      }
      else {
        pSrc = pSrc + 2;
      }
    }
    else {
      pSrc = pSrc + 1;
    }
  }
  *pInOut = *pInOut ^ (int)((uint)bVar2 << 0x19) >> 0x1f;
  return pSrc + 1;
}

Assistant:

const unsigned char *CVariableInt::Unpack(const unsigned char *pSrc, int *pInOut)
{
	const int Sign = (*pSrc >> 6) & 1;
	*pInOut = *pSrc & 0x3F;

	do
	{
		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << 6;

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << (6 + 7);

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x7F) << (6 + 7 + 7);

		if(!(*pSrc & 0x80))
			break;
		pSrc++;
		*pInOut |= (*pSrc & 0x0F) << (6 + 7 + 7 + 7);
	} while(false);

	pSrc++;
	*pInOut ^= -Sign; // if(sign) *i = ~(*i)
	return pSrc;
}